

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O0

int main(void)

{
  uint local_3c;
  int i_1;
  int m;
  int wei;
  int n;
  int i;
  int *w;
  HuffmanCode HC;
  HuffmanTree HT;
  
  HT._4_4_ = 0;
  printf("\nn =");
  __isoc99_scanf("%d",&m);
  _n = (int *)malloc((long)(m + 1) << 2);
  printf("\ninput the %d element\'s weight: \n",(ulong)(uint)m);
  for (local_3c = 1; (int)local_3c <= m; local_3c = local_3c + 1) {
    printf("%d: ",(ulong)local_3c);
    fflush(_stdin);
    __isoc99_scanf("%d",&i_1);
    _n[(int)local_3c] = i_1;
  }
  createHuffmanTree((HuffmanTree *)&HC,_n,m);
  creatHuffmanCode((HuffmanTree *)&HC,(HuffmanCode *)&w,m);
  return 0;
}

Assistant:

int main(void){
    HuffmanTree HT;
    HuffmanCode HC;
    int *w,i,n,wei,m;

    printf("\nn =");

    scanf("%d",&n);

    w = (int *)malloc((n + 1) * sizeof(int));

    printf("\ninput the %d element's weight: \n",n);

    for (int i = 1; i <= n;i++) {
        printf("%d: ",i);
        fflush(stdin);
        scanf("%d",&wei);
        w[i] = wei;
    }
    createHuffmanTree(&HT,w,n);
    creatHuffmanCode(&HT,&HC,n);

    return 0;
}